

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O1

size_t __thiscall CVmFile::read_str_byte_prefix(CVmFile *this,char *buf,size_t buflen)

{
  undefined8 in_RAX;
  ulong buflen_00;
  char b;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  read_bytes(this,(char *)&local_21,1);
  buflen_00 = (ulong)local_21;
  if (buflen_00 < buflen) {
    read_bytes(this,buf,buflen_00);
    buf[buflen_00] = '\0';
    return buflen_00;
  }
  err_throw(0x65);
}

Assistant:

size_t read_str_byte_prefix(char *buf, size_t buflen)
    {
        size_t len = read_byte();
        if (len+1 > buflen)
            err_throw(VMERR_READ_FILE);

        read_bytes(buf, len);
        buf[len] = '\0';
        return len;
    }